

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  long *plVar1;
  ReadableDirectory *pRVar2;
  ReadableFile *params;
  bool bVar3;
  ReadableDirectory **ppRVar4;
  Own<const_kj::ReadableFile,_std::nullptr_t> *params_3;
  Own<const_kj::ReadableFile,_std::nullptr_t> *pOVar5;
  Path *pPVar6;
  Maybe<kj::String> *params_4;
  char *in_RCX;
  SchemaFile *extraout_RDX;
  anon_class_24_3_14160855 *func;
  SchemaFile *extraout_RDX_00;
  SchemaFile *pSVar7;
  char *pcVar8;
  StringPtr SVar9;
  Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> MVar10;
  undefined1 local_350 [32];
  Own<const_kj::ReadableFile,_std::nullptr_t> *local_330;
  Own<const_kj::ReadableFile,_std::nullptr_t> *newFile_1;
  Event *local_320;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> local_318;
  undefined1 local_308 [8];
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile403;
  Maybe<kj::Exception> local_2e0;
  undefined1 local_148 [8];
  Maybe<kj::String> displayNameOverride;
  ArrayPtr<const_kj::String> local_118;
  undefined1 local_108 [8];
  Path parsed_1;
  undefined1 local_e8 [32];
  Own<const_kj::ReadableFile,_std::nullptr_t> *local_c8;
  Own<const_kj::ReadableFile,_std::nullptr_t> *newFile;
  Event *local_b8;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> local_b0;
  undefined1 local_a0 [8];
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _newFile384;
  ReadableDirectory *candidate;
  ReadableDirectory **__end3;
  ReadableDirectory **local_70;
  ReadableDirectory **__begin3;
  ArrayPtr<const_kj::ReadableDirectory_*const> *__range3;
  undefined1 local_50 [8];
  Path parsed;
  DiskSchemaFile *this_local;
  StringPtr target_local;
  
  this_local = (DiskSchemaFile *)target.content.size_;
  pcVar8 = target.content.ptr;
  target_local.content.ptr = in_RCX;
  target_local.content.size_ = (size_t)this;
  kj::StringPtr::StringPtr((StringPtr *)&parsed.parts.disposer,"/");
  bVar3 = kj::StringPtr::startsWith((StringPtr *)&this_local,(StringPtr *)&parsed.parts.disposer);
  if (bVar3) {
    SVar9 = kj::StringPtr::slice((StringPtr *)&this_local,1);
    kj::Path::parse((Path *)local_50,SVar9);
    local_70 = kj::ArrayPtr<const_kj::ReadableDirectory_*const>::begin
                         ((ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar8 + 0x28));
    ppRVar4 = kj::ArrayPtr<const_kj::ReadableDirectory_*const>::end
                        ((ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar8 + 0x28));
    for (; local_70 != ppRVar4; local_70 = local_70 + 1) {
      pRVar2 = *local_70;
      _newFile384.value.ptr = (ReadableFile *)pRVar2;
      kj::PathPtr::PathPtr((PathPtr *)&newFile,(Path *)local_50);
      (*(pRVar2->super_FsNode)._vptr_FsNode[10])(&local_b0,pRVar2,newFile,local_b8);
      kj::_::readMaybe<kj::ReadableFile_const,decltype(nullptr)>((_ *)local_a0,&local_b0);
      kj::Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::~Maybe(&local_b0);
      pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a0);
      if (pOVar5 != (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0) {
        local_c8 = kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::operator*
                             ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_a0);
        params = _newFile384.value.ptr;
        pPVar6 = kj::mv<kj::Path>((Path *)local_50);
        params_3 = kj::mv<kj::Own<kj::ReadableFile_const,decltype(nullptr)>>(local_c8);
        kj::
        heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::None_const&>
                  ((kj *)local_e8,(ReadableDirectory *)params,pPVar6,
                   (ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar8 + 0x28),params_3,
                   (None *)&kj::none);
        kj::
        implicitCast<kj::Own<capnp::SchemaFile,decltype(nullptr)>,kj::Own<capnp::SchemaFile::DiskSchemaFile,decltype(nullptr)>>
                  ((kj *)(local_e8 + 0x10),
                   (Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> *)local_e8);
        kj::Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> *)this,
                   (Own<capnp::SchemaFile,_std::nullptr_t> *)(local_e8 + 0x10));
        kj::Own<capnp::SchemaFile,_std::nullptr_t>::~Own
                  ((Own<capnp::SchemaFile,_std::nullptr_t> *)(local_e8 + 0x10));
        kj::Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t>::~Own
                  ((Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> *)local_e8);
      }
      parsed_1.parts.disposer._5_3_ = 0;
      parsed_1.parts.disposer._4_1_ = pOVar5 != (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0;
      kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_a0);
      if (parsed_1.parts.disposer._4_4_ != 0) goto LAB_00649576;
    }
    kj::Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> *)this);
    parsed_1.parts.disposer._4_4_ = 1;
LAB_00649576:
    kj::Path::~Path((Path *)local_50);
    pSVar7 = extraout_RDX;
  }
  else {
    local_118 = (ArrayPtr<const_kj::String>)kj::Path::parent((Path *)(pcVar8 + 0x10));
    displayNameOverride.ptr.field_1.value.content.disposer = (ArrayDisposer *)this_local;
    SVar9.content.size_ = (size_t)target_local.content.ptr;
    SVar9.content.ptr = (char *)this_local;
    kj::PathPtr::eval((Path *)local_108,(PathPtr *)&local_118,SVar9);
    kj::Maybe<kj::String>::Maybe((Maybe<kj::String> *)local_148);
    if ((pcVar8[0x60] & 1U) != 0) {
      _newFile403.value.ptr = (ReadableFile *)local_148;
      kj::
      runCatchingExceptions<capnp::SchemaFile::DiskSchemaFile::import(kj::StringPtr)const::_lambda()_1_>
                (&local_2e0,(kj *)&_newFile403.value.ptr,func);
      kj::Maybe<kj::Exception>::~Maybe(&local_2e0);
    }
    plVar1 = *(long **)(pcVar8 + 8);
    kj::PathPtr::PathPtr((PathPtr *)&newFile_1,(Path *)local_108);
    (**(code **)(*plVar1 + 0x50))(&local_318,plVar1,newFile_1,local_320);
    kj::_::readMaybe<kj::ReadableFile_const,decltype(nullptr)>((_ *)local_308,&local_318);
    kj::Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::~Maybe(&local_318);
    pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_308);
    if (pOVar5 == (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0) {
      kj::Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> *)this);
    }
    else {
      local_330 = kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::operator*
                            ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_308);
      pRVar2 = *(ReadableDirectory **)(pcVar8 + 8);
      pPVar6 = kj::mv<kj::Path>((Path *)local_108);
      pOVar5 = kj::mv<kj::Own<kj::ReadableFile_const,decltype(nullptr)>>(local_330);
      params_4 = kj::mv<kj::Maybe<kj::String>>((Maybe<kj::String> *)local_148);
      kj::
      heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
                ((kj *)local_350,pRVar2,pPVar6,
                 (ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar8 + 0x28),pOVar5,params_4);
      kj::
      implicitCast<kj::Own<capnp::SchemaFile,decltype(nullptr)>,kj::Own<capnp::SchemaFile::DiskSchemaFile,decltype(nullptr)>>
                ((kj *)(local_350 + 0x10),
                 (Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> *)local_350);
      kj::Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_> *)this,
                 (Own<capnp::SchemaFile,_std::nullptr_t> *)(local_350 + 0x10));
      kj::Own<capnp::SchemaFile,_std::nullptr_t>::~Own
                ((Own<capnp::SchemaFile,_std::nullptr_t> *)(local_350 + 0x10));
      kj::Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t>::~Own
                ((Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> *)local_350);
    }
    parsed_1.parts.disposer._4_4_ = 1;
    kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_308);
    kj::Maybe<kj::String>::~Maybe((Maybe<kj::String> *)local_148);
    kj::Path::~Path((Path *)local_108);
    pSVar7 = extraout_RDX_00;
  }
  MVar10.ptr.ptr = pSVar7;
  MVar10.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile,_std::nullptr_t>_>)MVar10.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_SOME(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(newFile), kj::none));
        }
      }
      return kj::none;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_SOME(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(newFile), kj::mv(displayNameOverride)));
      } else {
        return kj::none;
      }
    }